

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O2

void __thiscall
pstore::command_line::
help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
help<pstore::command_line::name>
          (help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,string *program_name,string *program_overview,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *outs,name *mods)

{
  option::option(&this->super_option);
  (this->super_option)._vptr_option = (_func_int **)&PTR__help_00198ce8;
  std::__cxx11::string::string((string *)&this->program_name_,(string *)program_name);
  std::__cxx11::string::string((string *)&this->overview_,(string *)program_overview);
  this->outs_ = outs;
  option::set_name(&this->super_option,&mods->name_);
  return;
}

Assistant:

explicit help (std::string program_name, std::string program_overview,
                           OutputStream & outs, Mods const &... mods)
                    : program_name_{std::move (program_name)}
                    , overview_{std::move (program_overview)}
                    , outs_{outs} {

                apply_to_option (*this, mods...);
            }